

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterWriteAttribute(xmlTextWriterPtr writer,xmlChar *name,xmlChar *content)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = xmlTextWriterStartAttribute(writer,name);
  iVar4 = -1;
  if (-1 < iVar1) {
    iVar2 = xmlTextWriterWriteString(writer,content);
    if (-1 < iVar2) {
      iVar3 = xmlTextWriterEndAttribute(writer);
      if (-1 < iVar3) {
        iVar4 = iVar2 + iVar1 + iVar3;
      }
    }
  }
  return iVar4;
}

Assistant:

int
xmlTextWriterWriteAttribute(xmlTextWriterPtr writer, const xmlChar * name,
                            const xmlChar * content)
{
    int count;
    int sum;

    sum = 0;
    count = xmlTextWriterStartAttribute(writer, name);
    if (count < 0)
        return -1;
    sum += count;
    count = xmlTextWriterWriteString(writer, content);
    if (count < 0)
        return -1;
    sum += count;
    count = xmlTextWriterEndAttribute(writer);
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}